

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

ScriptPubKeyMan * __thiscall wallet::CWallet::GetScriptPubKeyMan(CWallet *this,uint256 *id)

{
  long lVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  ScriptPubKeyMan *pSVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = std::
          map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
          ::count(&this->m_spk_managers,id);
  if (sVar2 == 0) {
    pSVar4 = (ScriptPubKeyMan *)0x0;
  }
  else {
    pmVar3 = std::
             map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
             ::at(&this->m_spk_managers,id);
    pSVar4 = (pmVar3->_M_t).
             super___uniq_ptr_impl<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::ScriptPubKeyMan_*,_std::default_delete<wallet::ScriptPubKeyMan>_>
             .super__Head_base<0UL,_wallet::ScriptPubKeyMan_*,_false>._M_head_impl;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pSVar4;
  }
  __stack_chk_fail();
}

Assistant:

ScriptPubKeyMan* CWallet::GetScriptPubKeyMan(const uint256& id) const
{
    if (m_spk_managers.count(id) > 0) {
        return m_spk_managers.at(id).get();
    }
    return nullptr;
}